

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

EventLoop * __thiscall
sznet::net::EventLoopThreadPool::getLoopForHash(EventLoopThreadPool *this,size_t hashCode)

{
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  value_type local_20;
  EventLoop *loop;
  size_t hashCode_local;
  EventLoopThreadPool *this_local;
  
  EventLoop::assertInLoopThread(this->m_baseLoop);
  local_20 = this->m_baseLoop;
  bVar1 = std::vector<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>::empty
                    (&this->m_loops);
  if (!bVar1) {
    sVar2 = std::vector<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>::size
                      (&this->m_loops);
    ppEVar3 = std::vector<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>::
              operator[](&this->m_loops,hashCode % sVar2);
    local_20 = *ppEVar3;
  }
  return local_20;
}

Assistant:

EventLoop* EventLoopThreadPool::getLoopForHash(size_t hashCode)
{
	m_baseLoop->assertInLoopThread();
	EventLoop* loop = m_baseLoop;

	if (!m_loops.empty())
	{
		loop = m_loops[hashCode % m_loops.size()];
	}
	return loop;
}